

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

void xmlCleanupCharEncodingHandlers(void)

{
  xmlCharEncodingHandlerPtr pxVar1;
  
  xmlCleanupEncodingAliases();
  if (globalHandlers != (xmlCharEncodingHandlerPtr *)0x0) {
    while (0 < nbCharEncodingHandler) {
      nbCharEncodingHandler = nbCharEncodingHandler - 1;
      pxVar1 = globalHandlers[(uint)nbCharEncodingHandler];
      if (pxVar1 != (xmlCharEncodingHandlerPtr)0x0) {
        if (pxVar1->name != (char *)0x0) {
          (*xmlFree)(pxVar1->name);
        }
        (*xmlFree)(pxVar1);
      }
    }
    (*xmlFree)(globalHandlers);
    globalHandlers = (xmlCharEncodingHandlerPtr *)0x0;
    nbCharEncodingHandler = 0;
  }
  return;
}

Assistant:

void
xmlCleanupCharEncodingHandlers(void) {
    xmlCleanupEncodingAliases();

    if (globalHandlers == NULL) return;

    for (;nbCharEncodingHandler > 0;) {
        xmlCharEncodingHandler *handler;

        nbCharEncodingHandler--;
        handler = globalHandlers[nbCharEncodingHandler];
	if (handler != NULL) {
	    if (handler->name != NULL)
		xmlFree(handler->name);
	    xmlFree(handler);
	}
    }
    xmlFree(globalHandlers);
    globalHandlers = NULL;
    nbCharEncodingHandler = 0;
}